

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib556.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ssize_t sVar4;
  size_t sVar5;
  size_t iolen;
  char buf [1024];
  size_t local_430;
  undefined1 local_428 [1032];
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar3 = curl_easy_init();
    if (lVar3 != 0) {
      iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
      if ((((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar3,0x8d,1), iVar1 == 0)) &&
          (iVar1 = curl_easy_setopt(lVar3,0x29,1), iVar1 == 0)) &&
         (iVar1 = curl_easy_perform(lVar3), iVar1 == 0)) {
        iVar1 = curl_easy_send(lVar3,"GET /556 HTTP/1.2\r\nHost: ninja\r\n\r\n",0x22,&local_430);
        if (iVar1 != 0) {
          return 0x77;
        }
        do {
          iVar2 = curl_easy_recv(lVar3,local_428,0x400);
          if (local_430 == 0) {
            sVar5 = 0;
          }
          else {
            sVar4 = write(1,local_428,local_430);
            sVar5 = local_430;
            if (sVar4 == 0) break;
          }
        } while ((iVar2 == 0x51) || (iVar2 == 0 && sVar5 != 0));
        iVar1 = 0;
        if (sVar5 != 0 || iVar2 != 0) {
          return 0x77;
        }
      }
      curl_easy_cleanup(lVar3);
      curl_global_cleanup();
      return iVar1;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_CONNECT_ONLY, 1L);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  res = curl_easy_perform(curl);

  if(!res) {
    /* we are connected, now get a HTTP document the raw way */
    const char *request =
#ifdef CURL_DOES_CONVERSIONS
      /* ASCII representation with escape sequences for non-ASCII platforms */
      "\x47\x45\x54\x20\x2f\x35\x35\x36\x20\x48\x54\x54\x50\x2f\x31\x2e"
      "\x32\x0d\x0a\x48\x6f\x73\x74\x3a\x20\x6e\x69\x6e\x6a\x61\x0d\x0a"
      "\x0d\x0a";
#else
      "GET /556 HTTP/1.2\r\n"
      "Host: ninja\r\n\r\n";
#endif
    size_t iolen;
    char buf[1024];

    res = curl_easy_send(curl, request, strlen(request), &iolen);

    if(!res) {
      /* we assume that sending always work */

      do {
        /* busy-read like crazy */
        res = curl_easy_recv(curl, buf, sizeof(buf), &iolen);

#ifdef TPF
        sleep(1); /* avoid ctl-10 dump */
#endif

        if(iolen) {
          /* send received stuff to stdout */
          if(!write(STDOUT_FILENO, buf, iolen))
            break;
        }

      } while((res == CURLE_OK && iolen != 0) || (res == CURLE_AGAIN));
    }

    if(res != CURLE_OK || iolen != 0)
      return TEST_ERR_FAILURE;
  }

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}